

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC1TL3SLLastIsScaled_Test::
~DatarateTestSVC_BasicRateTargetingSVC1TL3SLLastIsScaled_Test
          (DatarateTestSVC_BasicRateTargetingSVC1TL3SLLastIsScaled_Test *this)

{
  pointer pFVar1;
  pointer pcVar2;
  
  (this->super_DatarateTestSVC).
  super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__DatarateTestSVC_01075ad8;
  (this->super_DatarateTestSVC).
  super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__DatarateTestSVC_01075cf0;
  (this->super_DatarateTestSVC).super_DatarateTest.super_EncoderTest._vptr_EncoderTest =
       (_func_int **)&PTR__DatarateTestSVC_01075d10;
  pFVar1 = (this->super_DatarateTestSVC).frame_info_list_.
           super__Vector_base<datarate_test::(anonymous_namespace)::FrameInfo,_std::allocator<datarate_test::(anonymous_namespace)::FrameInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar1 != (pointer)0x0) {
    operator_delete(pFVar1);
  }
  (this->super_DatarateTestSVC).super_DatarateTest.super_EncoderTest._vptr_EncoderTest =
       (_func_int **)&PTR__EncoderTest_01081d70;
  pcVar2 = (this->super_DatarateTestSVC).super_DatarateTest.super_EncoderTest.stats_.buffer_.
           _M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 !=
      &(this->super_DatarateTestSVC).super_DatarateTest.super_EncoderTest.stats_.buffer_.field_2) {
    operator_delete(pcVar2);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC1TL3SLLastIsScaled) {
  BasicRateTargetingSVC1TL3SLLastIsScaledTest();
}